

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O3

TRef lj_opt_narrow_unm(jit_State *J,TRef rc,TValue *vc)

{
  TRef TVar1;
  TRef TVar2;
  IRRef1 IVar3;
  
  TVar1 = conv_str_tonum(J,rc,vc);
  if ((TVar1 >> 0x18 & 0x1f) - 0xf < 5) {
    IVar3 = (IRRef1)TVar1;
    if (((int)vc->n & 0x7fffffffU) != 0) {
      TVar1 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = IVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      lj_opt_fold(J);
      (J->fold).ins.field_0.ot = 0x3693;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
      (J->fold).ins.field_0.op2 = IVar3;
      goto LAB_0013463e;
    }
    (J->fold).ins.field_0.op1 = IVar3;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x590e01d3;
    TVar1 = lj_opt_fold(J);
  }
  TVar2 = lj_ir_ggfload(J,IRT_NUM,
                        (((ulong)((long)J->ksimd + 0x1fU) & 0xfffffffffffffff0) - (long)J) + 0x288);
  (J->fold).ins.field_0.ot = 0x2f0e;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
LAB_0013463e:
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

TRef lj_opt_narrow_unm(jit_State *J, TRef rc, TValue *vc)
{
  rc = conv_str_tonum(J, rc, vc);
  if (tref_isinteger(rc)) {
    uint32_t k = (uint32_t)numberVint(vc);
    if ((LJ_DUALNUM || k != 0) && k != 0x80000000u) {
      TRef zero = lj_ir_kint(J, 0);
      if (!LJ_DUALNUM)
	emitir(IRTGI(IR_NE), rc, zero);
      return emitir(IRTGI(IR_SUBOV), zero, rc);
    }
    rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  }
  return emitir(IRTN(IR_NEG), rc, lj_ir_ksimd(J, LJ_KSIMD_NEG));
}